

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuffixTree.h
# Opt level: O1

bool __thiscall
flow::util::
SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
::lookup(SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
         *this,Key *key,Value *value)

{
  pointer pcVar1;
  Node *pNVar2;
  Value *pVVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  ulong __code;
  size_type sVar6;
  
  pcVar1 = (key->_M_dataplus)._M_p;
  sVar6 = key->_M_string_length;
  do {
    if (sVar6 == 0) break;
    __code = (ulong)pcVar1[sVar6 - 1];
    p_Var4 = std::
             _Hashtable<char,_std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->root_).children._M_h,
                        __code % (this->root_).children._M_h._M_bucket_count,pcVar1 + (sVar6 - 1),
                        __code);
    p_Var5 = (_Hash_node_base *)0x0;
    if (p_Var4 != (__node_base_ptr)0x0) {
      p_Var5 = p_Var4->_M_nxt;
    }
    if (p_Var5 != (_Hash_node_base *)0x0) {
      this = (SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              *)p_Var5[2]._M_nxt;
    }
    sVar6 = sVar6 - 1;
  } while (p_Var5 != (_Hash_node_base *)0x0);
  while ((&this->root_ != (Node *)0x0 &&
         (pNVar2 = ((Node *)&(this->root_).parent)->parent, pNVar2 != (Node *)0x0))) {
    pVVar3 = &(this->root_).value;
    this = (SuffixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            *)pNVar2;
    if (*pVVar3 != 0) {
      *value = *pVVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool SuffixTree<K, V>::lookup(const Key& key, Value* value) const {
  const Node* level = &root_;

  for (auto i = key.rbegin(), e = key.rend(); i != e; ++i) {
    auto k = level->children.find(*i);
    if (k == level->children.end())
      break;

    level = k->second.get();
  }

  while (level && level->parent) {
    if (level->value) {
      *value = level->value;
      return true;
    }
    level = level->parent;
  }

  return false;
}